

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplicitCovariance.hpp
# Opt level: O2

vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
* __thiscall
njoy::ENDFtk::readSequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
           *__return_storage_ptr__,ENDFtk *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int size)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffff1c;
  CovariancePairs local_c0;
  ListRecord list;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
  ::reserve(__return_storage_ptr__,(long)MT);
  while( true ) {
    bVar2 = MT == 0;
    MT = MT + -1;
    if (bVar2) {
      return __return_storage_ptr__;
    }
    iVar3 = MF;
    ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&list,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    if (9 < (ulong)list.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl) break;
    if ((799UL >> (list.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl & 0x3fU) & 1) == 0) {
      if (list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl == 5) {
        section::SquareMatrix::SquareMatrix((SquareMatrix *)&local_c0,&list);
        std::
        vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
        ::emplace_back<njoy::ENDFtk::section::SquareMatrix>
                  (__return_storage_ptr__,(SquareMatrix *)&local_c0);
      }
      else {
        if (list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl != 6) break;
        section::RectangularMatrix::RectangularMatrix((RectangularMatrix *)&local_c0,&list);
        std::
        vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
        ::emplace_back<njoy::ENDFtk::section::RectangularMatrix>
                  (__return_storage_ptr__,(RectangularMatrix *)&local_c0);
      }
    }
    else {
      section::CovariancePairs::CovariancePairs(&local_c0,&list);
      std::
      vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
      ::emplace_back<njoy::ENDFtk::section::CovariancePairs>(__return_storage_ptr__,&local_c0);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_c0.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&list.data.super__Vector_base<double,_std::allocator<double>_>);
  }
  tools::Log::error<char_const*>((char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
  tools::Log::info<char_const*>((char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
  tools::Log::info<char_const*,long>
            ("LB value: {}",
             list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl);
  tools::Log::info<char_const*,long>("Line number: {}",(long)(end->_M_current + -1));
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

std::vector< section::ExplicitCovariance >
readSequence( Iterator& begin,
              const Iterator& end,
              long& lineNumber,
              int MAT,
              int MF,
              int MT,
              int size ) {

  std::vector< section::ExplicitCovariance > sequence;
  sequence.reserve( size );

  while ( size-- ) {

    ListRecord list( begin, end, lineNumber, MAT, MF, MT );

    switch ( list.L2() ) {

      // CovariancePairs
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 8:
      case 9:
        sequence.emplace_back( section::CovariancePairs( std::move( list ) ) );
        break;

      // SquareMatrix
      case 5:
        sequence.emplace_back( section::SquareMatrix( std::move( list ) ) );
        break;

      // RectangularMatrix
      case 6:
        sequence.emplace_back( section::RectangularMatrix( std::move( list ) ) );
        break;

      // Error
      default:
        Log::error( "Encountered illegal LB value" );
        Log::info( "LB can only be 0,1,2,3,4,5,6,8,9" );
        Log::info( "LB value: {}", list.L2() );
        Log::info( "Line number: {}", lineNumber - 1 );
        throw std::exception();
    }
  }

  return sequence;
}